

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O2

char_class charclass(uchar c)

{
  int iVar1;
  char_class cVar2;
  int c_00;
  undefined7 in_register_00000039;
  
  c_00 = (int)CONCAT71(in_register_00000039,c);
  iVar1 = Curl_isupper(c_00);
  if (iVar1 == 0) {
    iVar1 = Curl_islower(c_00);
    if (iVar1 == 0) {
      iVar1 = Curl_isdigit(c_00);
      cVar2 = (char_class)(iVar1 != 0);
    }
    else {
      cVar2 = CCLASS_LOWER;
    }
  }
  else {
    cVar2 = CCLASS_UPPER;
  }
  return cVar2;
}

Assistant:

static char_class charclass(unsigned char c)
{
  if(ISUPPER(c))
    return CCLASS_UPPER;
  if(ISLOWER(c))
    return CCLASS_LOWER;
  if(ISDIGIT(c))
    return CCLASS_DIGIT;
  return CCLASS_OTHER;
}